

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkIvySat(Abc_Ntk_t *pNtk,int nConfLimit,int fVerbose)

{
  Ivy_Man_t *pManAig;
  Ivy_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  Ivy_FraigParams_t *pParams;
  Ivy_FraigParams_t Params;
  Ivy_FraigParams_t IStack_68;
  
  pAVar1 = (Abc_Ntk_t *)0x0;
  pManAig = Abc_NtkIvyBefore(pNtk,0,0);
  if (pManAig != (Ivy_Man_t *)0x0) {
    Ivy_FraigParamsDefault(&IStack_68);
    IStack_68.fVerbose = fVerbose;
    IStack_68.nBTLimitMiter = nConfLimit;
    pMan = Ivy_FraigMiter(pManAig,&IStack_68);
    Ivy_ManStop(pManAig);
    pAVar1 = Abc_NtkIvyAfter(pNtk,pMan,0,0);
    Ivy_ManStop(pMan);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvySat( Abc_Ntk_t * pNtk, int nConfLimit, int fVerbose )
{
    Ivy_FraigParams_t Params, * pParams = &Params; 
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan, * pTemp;
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    Ivy_FraigParamsDefault( pParams );
    pParams->nBTLimitMiter = nConfLimit;
    pParams->fVerbose = fVerbose;
//    pMan = Ivy_FraigPerform( pTemp = pMan, pParams );
    pMan = Ivy_FraigMiter( pTemp = pMan, pParams );
    Ivy_ManStop( pTemp );
    pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
    Ivy_ManStop( pMan );
    return pNtkAig;
}